

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

vec4 __thiscall rengine::StaticRenderTest::pixel(StaticRenderTest *this,int x,int y)

{
  uint uVar1;
  vec4 vVar2;
  
  if (x < 0) {
    __assert_fail("x >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                  ,0x88,"vec4 rengine::StaticRenderTest::pixel(int, int)");
  }
  if (this->m_w <= x) {
    __assert_fail("x < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                  ,0x89,"vec4 rengine::StaticRenderTest::pixel(int, int)");
  }
  if (y < 0) {
    __assert_fail("y >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                  ,0x8a,"vec4 rengine::StaticRenderTest::pixel(int, int)");
  }
  if (y < this->m_h) {
    uVar1 = this->m_pixels[(uint)(this->m_w * y + x)];
    vVar2.x = (float)(uVar1 & 0xff) / 255.0;
    vVar2.y = (float)(uVar1 >> 8 & 0xff) / 255.0;
    vVar2.z = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
    vVar2.w = (float)(uVar1 >> 0x18) / 255.0;
    return vVar2;
  }
  __assert_fail("y < m_h",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                ,0x8b,"vec4 rengine::StaticRenderTest::pixel(int, int)");
}

Assistant:

vec4 pixel(int x, int y) {
        assert(x >= 0);
        assert(x < m_w);
        assert(y >= 0);
        assert(y < m_h);
        unsigned pixel = m_pixels[y * m_w + x];
        return vec4((pixel & 0x000000ff) >> 0,
                          (pixel & 0x0000ff00) >> 8,
                          (pixel & 0x00ff0000) >> 16,
                          (pixel & 0xff000000) >> 24) / 255.0;
    }